

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * duckdb_fmt::v6::internal::
       parse_precision<char,duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,duckdb_fmt::v6::internal::error_handler>,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>
                 *handler)

{
  char cVar1;
  type tVar2;
  specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
  *this;
  int iVar3;
  char *pcVar4;
  anon_union_8_2_de49483c_for_basic_format_args<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_2
  aVar5;
  anon_union_8_2_de49483c_for_basic_format_args<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_2
  aVar6;
  uint uVar7;
  size_type __dnew;
  anon_union_8_2_de49483c_for_basic_format_args<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_2
  local_98;
  basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
  *local_90;
  basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
  *local_88 [2];
  basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
  *local_78;
  anon_union_8_2_de49483c_for_basic_format_args<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_2
  local_70 [2];
  undefined1 local_60 [16];
  anon_union_8_2_de49483c_for_basic_format_args<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_2
  local_50;
  undefined1 local_40 [16];
  
  pcVar4 = begin + 1;
  if (pcVar4 == end) {
    iVar3 = 0;
  }
  else {
    iVar3 = (int)*pcVar4;
  }
  if (iVar3 - 0x30U < 10) {
    if (*pcVar4 == '0') {
      end = begin + 2;
      uVar7 = 0;
    }
    else {
      pcVar4 = begin + 2;
      uVar7 = 0;
      do {
        if (0xccccccc < uVar7) {
          uVar7 = 0x80000000;
          break;
        }
        uVar7 = ((int)pcVar4[-1] + uVar7 * 10) - 0x30;
        if (pcVar4 == end) goto LAB_007642ff;
        cVar1 = *pcVar4;
        pcVar4 = pcVar4 + 1;
      } while ((byte)(cVar1 - 0x30U) < 10);
      end = pcVar4 + -1;
LAB_007642ff:
      if ((int)uVar7 < 0) {
        local_78 = (basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
                    *)0x11;
        local_98.values_ =
             (value<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
              *)local_88;
        local_98.values_ =
             (value<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
              *)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_78);
        local_88[0] = local_78;
        ((local_98.args_)->value_).field_0.long_long_value = 0x69207265626d756e;
        (&((local_98.args_)->value_).field_0.long_long_value)[1] = 0x6962206f6f742073;
        *(undefined1 *)&local_98.values_[1].field_0 = 0x67;
        local_90 = local_78;
        *(undefined1 *)
         ((long)&((local_98.args_)->value_).field_0 + (long)&(local_78->out_).container) = 0;
        specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
        ::on_error(&handler->
                    super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                   ,(string *)&local_98);
        if (local_98.values_ !=
            (value<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
             *)local_88) {
          operator_delete(local_98.values_);
        }
      }
    }
    ((handler->
     super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
     ).super_specs_setter<char>.specs_)->precision = uVar7;
LAB_00764373:
    tVar2 = (handler->checker_).arg_type_;
    if (tVar2 != pointer_type && 8 < tVar2 - named_arg_type) {
      return end;
    }
    this = (handler->checker_).error_handler_;
    local_78 = (basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
                *)0x2c;
    local_98.values_ =
         (value<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
          *)local_88;
    local_98.values_ =
         (value<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
          *)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_78);
    local_88[0] = local_78;
    ((specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
      *)&(local_98.args_)->value_)->super_specs_setter<char> =
         (specs_setter<char>)0x6f69736963657270;
    ((specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
      *)&(local_98.args_)->value_)->parse_context_ =
         (basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler> *)
         0x6c6120746f6e206e;
    *(undefined8 *)(local_98.values_ + 1) = 0x6f66206465776f6c;
    *(undefined8 *)((long)(local_98.values_ + 1) + 8) = 0x6120736968742072;
    *(undefined8 *)((long)(local_98.values_ + 1) + 0xc) = 0x6d75677261207369;
    *(undefined8 *)((long)(local_98.values_ + 2) + 4) = 0x6570797420746e65;
    local_90 = local_78;
    *(undefined1 *)
     ((long)&((specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
               *)&(local_98.args_)->value_)->super_specs_setter<char> +
     (long)&(local_78->out_).container) = 0;
    specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
    ::on_error(this,(string *)&local_98);
    aVar5 = local_98;
    pcVar4 = end;
    if (local_98.values_ ==
        (value<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
         *)local_88) {
      return end;
    }
  }
  else {
    if (iVar3 == 0x7b) {
      pcVar4 = begin + 2;
      if (pcVar4 != end) {
        local_98 = (anon_union_8_2_de49483c_for_basic_format_args<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_2
                    )handler;
        pcVar4 = parse_arg_id<char,duckdb_fmt::v6::internal::precision_adapter<duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,duckdb_fmt::v6::internal::error_handler>,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>&,char>>
                           (pcVar4,end,
                            (precision_adapter<duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>_&,_char>
                             *)&local_98);
      }
      if ((pcVar4 != end) && (end = pcVar4 + 1, cVar1 = *pcVar4, pcVar4 = end, cVar1 == '}'))
      goto LAB_00764373;
      aVar6.values_ =
           (value<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
            *)(local_60 + 0x20);
      local_50.values_ = aVar6.values_;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_60 + 0x10),"invalid format string","");
      specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
      ::on_error(&handler->
                  super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                 ,(string *)(local_60 + 0x10));
      aVar5 = local_50;
    }
    else {
      aVar6.values_ =
           (value<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
            *)local_60;
      local_70[0].values_ = aVar6.values_;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_70,"missing precision specifier","");
      specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
      ::on_error(&handler->
                  super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                 ,(string *)local_70);
      aVar5 = local_70[0];
    }
    if (aVar5.values_ == aVar6.values_) {
      return pcVar4;
    }
  }
  operator_delete(aVar5.values_);
  return pcVar4;
}

Assistant:

FMT_CONSTEXPR const Char* parse_precision(const Char* begin, const Char* end,
                                          Handler&& handler) {
  ++begin;
  auto c = begin != end ? *begin : Char();
  if ('0' <= c && c <= '9') {
    handler.on_precision(parse_nonnegative_int(begin, end, handler));
  } else if (c == '{') {
    ++begin;
    if (begin != end) {
      begin =
          parse_arg_id(begin, end, precision_adapter<Handler, Char>(handler));
    }
    if (begin == end || *begin++ != '}')
      return handler.on_error("invalid format string"), begin;
  } else {
    return handler.on_error("missing precision specifier"), begin;
  }
  handler.end_precision();
  return begin;
}